

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityAppearance *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EntityAppearance *local_18;
  EntityAppearance *this_local;
  
  local_18 = this;
  this_local = (EntityAppearance *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Entity Appearance Data: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_Appearance);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EntityAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Entity Appearance Data: " << m_Appearance << "\n";

    return ss.str();
}